

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O2

void ncnn::resize_bilinear_c3
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  int iVar2;
  float fVar3;
  short *psVar4;
  short b0;
  int iVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  short *rows1p;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  short *rows0_old;
  short *psVar16;
  short *rows0p;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  uint uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  int *local_138;
  Mat local_c8;
  Mat local_78;
  
  uVar21 = (h + w) * 2;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (int)uVar21) {
    uVar9 = (ulong)uVar21 * 4;
  }
  piVar7 = (int *)operator_new__(uVar9);
  lVar10 = (long)w;
  lVar8 = (long)h;
  uVar9 = 0;
  if (0 < w) {
    uVar9 = (ulong)(uint)w;
  }
  lVar1 = lVar8 * 4 + lVar10 * 4;
  for (uVar17 = 0; uVar9 != uVar17; uVar17 = uVar17 + 1) {
    fVar3 = ((float)(int)uVar17 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
    fVar22 = floorf(fVar3);
    iVar5 = (int)fVar22;
    fVar25 = 0.0;
    bVar20 = -1 < iVar5;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (bVar20) {
      fVar25 = (fVar3 - (float)(int)fVar22) * 2048.0;
    }
    iVar6 = iVar5;
    if (srcw + -1 <= iVar5) {
      iVar6 = srcw + -2;
    }
    piVar7[uVar17] = iVar6 * 3;
    if (srcw + -1 <= iVar5) {
      fVar25 = 2048.0;
    }
    uVar21 = -(uint)(0.0 <= 2048.0 - fVar25);
    auVar23._0_4_ = (int)((float)(uVar21 & 0x3f000000 | ~uVar21 & 0xbf000000) + (2048.0 - fVar25));
    auVar23._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar25) & 0x3f000000 | ~-(uint)(0.0 <= fVar25) & 0xbf000000) +
              fVar25);
    auVar23._8_8_ = 0;
    auVar23 = packssdw(auVar23,auVar23);
    piVar7[lVar10 + lVar8 + uVar17] = auVar23._0_4_;
  }
  uVar17 = 0;
  if (0 < h) {
    uVar17 = (ulong)(uint)h;
  }
  local_138 = piVar7 + lVar8 + lVar10 * 2;
  for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
    fVar3 = ((float)(int)uVar18 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
    fVar22 = floorf(fVar3);
    iVar6 = (int)fVar22;
    fVar25 = 0.0;
    iVar5 = iVar6;
    if (iVar6 < 1) {
      iVar5 = 0;
    }
    if (-1 < iVar6) {
      fVar25 = (fVar3 - (float)(int)fVar22) * 2048.0;
    }
    iVar6 = iVar5;
    if (srch + -1 <= iVar5) {
      iVar6 = srch + -2;
    }
    piVar7[lVar10 + uVar18] = iVar6;
    if (srch + -1 <= iVar5) {
      fVar25 = 2048.0;
    }
    uVar21 = -(uint)(0.0 <= 2048.0 - fVar25);
    auVar24._0_4_ = (int)((float)(uVar21 & 0x3f000000 | ~uVar21 & 0xbf000000) + (2048.0 - fVar25));
    auVar24._4_4_ =
         (int)((float)(-(uint)(0.0 <= fVar25) & 0x3f000000 | ~-(uint)(0.0 <= fVar25) & 0xbf000000) +
              fVar25);
    auVar24._8_8_ = 0;
    auVar23 = packssdw(auVar24,auVar24);
    local_138[uVar18] = auVar23._0_4_;
  }
  iVar5 = w * 3 + 1;
  local_c8.cstep = 0;
  local_c8.data = (short *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,iVar5,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (short *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,iVar5,2,(Allocator *)0x0);
  rows1p = (short *)local_78.data;
  psVar16 = (short *)local_c8.data;
  iVar5 = 0;
  iVar6 = -2;
LAB_0012c445:
  do {
    if (h <= iVar5) {
      operator_delete__(piVar7);
      piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            free(local_78.data);
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            free(local_c8.data);
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return;
    }
    iVar2 = piVar7[lVar10 + iVar5];
    psVar4 = rows1p;
    rows0p = psVar16;
    if (iVar2 != iVar6) {
      if (iVar2 == iVar6 + 1) {
        iVar6 = (iVar2 + 1) * srcstride;
        piVar11 = piVar7;
        for (lVar12 = 0; psVar4 = psVar16, rows0p = rows1p, uVar9 * 6 - lVar12 != 0;
            lVar12 = lVar12 + 6) {
          lVar13 = (long)*piVar11;
          iVar19 = (int)(short)piVar11[lVar10 + lVar8];
          iVar14 = (int)*(short *)((long)piVar11 + lVar1 + 2);
          *(short *)((long)psVar16 + lVar12) =
               (short)((uint)src[lVar13 + (long)iVar6 + 3] * iVar14 +
                       (uint)src[lVar13 + iVar6] * iVar19 >> 4);
          *(short *)((long)psVar16 + lVar12 + 2) =
               (short)((uint)src[lVar13 + (long)iVar6 + 4] * iVar14 +
                       (uint)src[lVar13 + (long)iVar6 + 1] * iVar19 >> 4);
          *(short *)((long)psVar16 + lVar12 + 4) =
               (short)((uint)src[lVar13 + (long)iVar6 + 5] * iVar14 +
                       (uint)src[lVar13 + (long)iVar6 + 2] * iVar19 >> 4);
          piVar11 = piVar11 + 1;
        }
      }
      else {
        iVar6 = iVar2 * srcstride;
        iVar19 = (iVar2 + 1) * srcstride;
        piVar11 = piVar7;
        for (lVar12 = 0; uVar9 * 6 - lVar12 != 0; lVar12 = lVar12 + 6) {
          lVar13 = (long)*piVar11;
          iVar15 = (int)(short)piVar11[lVar10 + lVar8];
          iVar14 = (int)*(short *)((long)piVar11 + lVar1 + 2);
          *(short *)((long)psVar16 + lVar12) =
               (short)((uint)src[lVar13 + (long)iVar6 + 3] * iVar14 +
                       (uint)src[lVar13 + iVar6] * iVar15 >> 4);
          *(short *)((long)psVar16 + lVar12 + 2) =
               (short)((uint)src[lVar13 + (long)iVar6 + 4] * iVar14 +
                       (uint)src[lVar13 + (long)iVar6 + 1] * iVar15 >> 4);
          *(short *)((long)psVar16 + lVar12 + 4) =
               (short)((uint)src[lVar13 + (long)iVar6 + 5] * iVar14 +
                       (uint)src[lVar13 + (long)iVar6 + 2] * iVar15 >> 4);
          *(short *)((long)rows1p + lVar12) =
               (short)((uint)src[lVar13 + (long)iVar19 + 3] * iVar14 +
                       (uint)src[lVar13 + iVar19] * iVar15 >> 4);
          *(short *)((long)rows1p + lVar12 + 2) =
               (short)((uint)src[lVar13 + (long)iVar19 + 4] * iVar14 +
                       (uint)src[lVar13 + (long)iVar19 + 1] * iVar15 >> 4);
          *(short *)((long)rows1p + lVar12 + 4) =
               (short)((uint)src[lVar13 + (long)iVar19 + 5] * iVar14 +
                       (uint)src[lVar13 + (long)iVar19 + 2] * iVar15 >> 4);
          piVar11 = piVar11 + 1;
        }
      }
    }
    rows1p = psVar4;
    iVar19 = iVar5 + 1;
    psVar16 = rows0p;
    iVar6 = iVar2;
    if (iVar19 < h) {
      b0 = (short)*local_138;
      if (piVar7[lVar10 + iVar19] == iVar2) {
        vresize_two(rows0p,rows1p,w * 3,dst + iVar5 * stride,dst + iVar19 * stride,b0,
                    *(short *)((long)local_138 + 2),(short)local_138[1],
                    *(short *)((long)local_138 + 6));
        local_138 = local_138 + 2;
        iVar5 = iVar5 + 2;
        goto LAB_0012c445;
      }
    }
    else {
      b0 = (short)*local_138;
    }
    vresize_one(rows0p,rows1p,w * 3,dst + iVar5 * stride,b0,*(short *)((long)local_138 + 2));
    local_138 = local_138 + 1;
    iVar5 = iVar19;
  } while( true );
}

Assistant:

void resize_bilinear_c3(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx * 3;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w * 3 + 1, (size_t)2u);
    Mat rowsbuf1(w * 3 + 1, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 3;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p + 1, _S0, 1);
                _S0 = vld1_lane_u8(S0p + 2, _S0, 2);
                _S0 = vld1_lane_u8(S0p + 3, _S0, 3);
                _S0 = vld1_lane_u8(S0p + 4, _S0, 4);
                _S0 = vld1_lane_u8(S0p + 5, _S0, 5);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vext_s16(_S0low, vget_high_s16(_S016), 3);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0] * a0 + S0p[3] * a1) >> 4;
                rows0p[1] = (S0p[1] * a0 + S0p[4] * a1) >> 4;
                rows0p[2] = (S0p[2] * a0 + S0p[5] * a1) >> 4;
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 3;
                rows1p += 3;
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            unsigned char* Dp0 = dst + stride * dy;
            unsigned char* Dp1 = dst + stride * (dy + 1);

            vresize_two(rows0, rows1, w * 3, Dp0, Dp1, ibeta[0], ibeta[1], ibeta[2], ibeta[3]);

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            unsigned char* Dp = dst + stride * dy;

            vresize_one(rows0, rows1, w * 3, Dp, ibeta[0], ibeta[1]);

            ibeta += 2;
        }
    }

    delete[] buf;
}